

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void get_remote_block_neg
               (Integer idx,Integer ndim,Integer *lo_loc,Integer *hi_loc,Integer *slo_rem,
               Integer *shi_rem,Integer *dims,Integer *width)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  Integer i;
  long alStack_b8 [7];
  Integer hi_rem [7];
  Integer lo_rem [7];
  
  for (lo_rem[1] = 0; lo_rem[1] < in_RSI; lo_rem[1] = lo_rem[1] + 1) {
    if (lo_rem[1] == in_RDI) {
      hi_rem[lo_rem[1] + 1] = *(long *)(in_RDX + lo_rem[1] * 8) - slo_rem[lo_rem[1]];
      alStack_b8[lo_rem[1]] = *(long *)(in_RDX + lo_rem[1] * 8) + -1;
    }
    else {
      hi_rem[lo_rem[1] + 1] = *(Integer *)(in_RDX + lo_rem[1] * 8);
      alStack_b8[lo_rem[1]] = *(long *)(in_RCX + lo_rem[1] * 8);
    }
  }
  for (lo_rem[1] = 0; lo_rem[1] < in_RSI; lo_rem[1] = lo_rem[1] + 1) {
    if (lo_rem[1] == in_RDI) {
      if (hi_rem[lo_rem[1] + 1] < 1) {
        *(Integer *)(in_R8 + lo_rem[1] * 8) = (shi_rem[lo_rem[1]] - slo_rem[lo_rem[1]]) + 1;
        *(Integer *)(in_R9 + lo_rem[1] * 8) = shi_rem[lo_rem[1]];
      }
      else {
        *(Integer *)(in_R8 + lo_rem[1] * 8) = hi_rem[lo_rem[1] + 1];
        *(long *)(in_R9 + lo_rem[1] * 8) = alStack_b8[lo_rem[1]];
      }
    }
    else {
      *(Integer *)(in_R8 + lo_rem[1] * 8) = hi_rem[lo_rem[1] + 1];
      *(long *)(in_R9 + lo_rem[1] * 8) = alStack_b8[lo_rem[1]];
    }
  }
  return;
}

Assistant:

static void get_remote_block_neg(Integer idx, Integer ndim, Integer *lo_loc,
                          Integer *hi_loc, Integer *slo_rem, Integer *shi_rem,
                          Integer *dims, Integer *width)
{
  Integer i, lo_rem[MAXDIM], hi_rem[MAXDIM];
  /*Start by getting rough idea of where data needs to go. */
  for (i = 0; i < ndim; i++) {
    if (i == idx) {
      lo_rem[i] = lo_loc[i] - width[i];
      hi_rem[i] = lo_loc[i] - 1;
    } else {
      lo_rem[i] = lo_loc[i];
      hi_rem[i] = hi_loc[i];
    }
  }

  /* Account for boundaries, if necessary. */
  for (i=0; i<ndim; i++) {
    if (i == idx) {
      if (lo_rem[i] < 1) {
        slo_rem[i] = dims[i] - width[i] + 1;
        shi_rem[i] = dims[i];
      } else {
        slo_rem[i] = lo_rem[i];
        shi_rem[i] = hi_rem[i];
      }
    } else {
      slo_rem[i] = lo_rem[i];
      shi_rem[i] = hi_rem[i];
    }
  }
}